

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O2

char ** lua_rl_complete(char *text,int start,int end)

{
  char cVar1;
  char cVar2;
  lua_State *L;
  int idx;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  size_t sVar8;
  int suf;
  long lVar9;
  long lVar10;
  dmlist local_68;
  long local_40;
  char *local_38;
  
  L = lua_rl_L;
  cVar1 = *text;
  if ((((long)cVar1 != 0) && (ppuVar4 = __ctype_b_loc(), cVar1 != '_')) &&
     (((*ppuVar4)[cVar1] & 0x400) == 0)) {
    return (char **)0x0;
  }
  local_68.allocated = 0;
  local_68.matchlen = 0;
  local_68.list = (char **)0x0;
  local_68.idx = 0;
  idx = lua_gettop(L);
  lua_pushvalue(L,-0x2712);
  sVar8 = 0;
  lVar9 = (long)start - (long)end;
LAB_001086e0:
  uVar7 = 0x15;
  lVar10 = 0;
  pcVar5 = text;
  while( true ) {
    if (lVar9 + sVar8 == lVar10) {
      if (sVar8 != 0) goto LAB_001087d0;
      lVar9 = 0;
      goto LAB_001089d1;
    }
    if ((pcVar5[sVar8] == '.') || (pcVar5[sVar8] == ':')) break;
    lVar10 = lVar10 + -1;
    pcVar5 = pcVar5 + 1;
  }
  local_38 = text + sVar8;
  local_40 = lVar9;
  do {
    iVar3 = lua_type(L,-1);
    if (iVar3 == 5) {
      lua_pushlstring(L,local_38,-lVar10);
      lua_rawget(L,-2);
      iVar3 = lua_type(L,-1);
      if (iVar3 != 0) goto LAB_00108782;
      lua_settop(L,-2);
    }
    uVar7 = uVar7 - 1;
    if ((uVar7 < 2) || (iVar3 = lua_rl_getmetaindex(L), iVar3 == 0)) {
      lua_settop(L,-2);
      goto LAB_001087aa;
    }
  } while( true );
LAB_001089d1:
  if (lVar9 == 0xa8) goto LAB_001087d0;
  pcVar5 = *(char **)((long)lua_rl_keywords + lVar9);
  iVar3 = strncmp(pcVar5,text,(long)(end - start));
  if ((iVar3 == 0) && (iVar3 = lua_rl_dmadd(&local_68,(char *)0x0,0,pcVar5,0x20), iVar3 != 0))
  goto LAB_001087aa;
  lVar9 = lVar9 + 8;
  goto LAB_001089d1;
LAB_00108782:
  lua_replace(L,-2);
  sVar8 = (sVar8 - lVar10) + 1;
  lVar9 = local_40;
  goto LAB_001086e0;
LAB_001087d0:
  lVar9 = 0;
  do {
    iVar3 = lua_type(L,-1);
    if ((iVar3 == 5) && ((lVar9 == 0 || (iVar3 = lua_rawequal(L,-1,-0x2712), iVar3 == 0)))) {
      lua_pushnil(L);
      while (iVar3 = lua_next(L,-2), iVar3 != 0) {
        iVar3 = lua_type(L,-2);
        if (iVar3 == 4) {
          pcVar5 = lua_tolstring(L,-2,(size_t *)0x0);
          iVar3 = strncmp(pcVar5,text + sVar8,(long)(end - start) - sVar8);
          if (iVar3 == 0) {
            ppuVar4 = __ctype_b_loc();
            cVar1 = *pcVar5;
            if (((long)cVar1 == 0x5f) || (((*ppuVar4)[cVar1] & 0x400) != 0)) {
              pcVar6 = pcVar5 + 1;
              do {
                cVar2 = *pcVar6;
                if ((long)cVar2 == 0) {
                  if ((cVar1 != '_') || (text[sVar8] == '_')) {
                    iVar3 = lua_type(L,-1);
                    if (iVar3 == 7) {
                      iVar3 = lua_getmetatable(L,-1);
                      suf = 0x20;
                      if (iVar3 != 0) {
                        lua_settop(L,-2);
                        suf = 0x3a;
                      }
                    }
                    else if (iVar3 == 6) {
                      suf = 0x28;
                    }
                    else {
                      suf = 0x20;
                      if (iVar3 == 5) {
                        suf = 0x2e;
                      }
                    }
                    iVar3 = lua_rl_dmadd(&local_68,text,sVar8,pcVar5,suf);
                    if (iVar3 != 0) goto LAB_001087aa;
                  }
                  break;
                }
                pcVar6 = pcVar6 + 1;
              } while ((cVar2 == '_') || (((*ppuVar4)[cVar2] & 0xc00) != 0));
            }
          }
        }
        lua_settop(L,-2);
      }
    }
    if (lVar9 == 0x13) break;
    lVar9 = lVar9 + 1;
    iVar3 = lua_rl_getmetaindex(L);
  } while (iVar3 != 0);
  sVar8 = local_68.matchlen;
  if (local_68.idx != 0) {
    pcVar5 = (char *)malloc(local_68.matchlen + 1);
    *local_68.list = pcVar5;
    if (pcVar5 != (char *)0x0) {
      memcpy(pcVar5,local_68.list[1],sVar8);
      pcVar5[sVar8] = '\0';
      iVar3 = lua_rl_dmadd(&local_68,(char *)0x0,0,(char *)0x0,0);
      if (iVar3 == 0) {
        lua_settop(L,idx);
        _rl_completion_suppress_append = 1;
        return local_68.list;
      }
    }
  }
LAB_001087aa:
  lua_settop(L,idx);
  return (char **)0x0;
}

Assistant:

static char **lua_rl_complete(const char *text, int start, int end)
{
  lua_State *L = lua_rl_L;
  dmlist ml;
  const char *s;
  size_t i, n, dot, loop;
  int savetop;

  if (!(text[0] == '\0' || isalpha(text[0]) || text[0] == '_')) return NULL;

  ml.list = NULL;
  ml.idx = ml.allocated = ml.matchlen = 0;

  savetop = lua_gettop(L);
  lua_pushvalue(L, LUA_GLOBALSINDEX);
  for (n = (size_t)(end-start), i = dot = 0; i < n; i++)
    if (text[i] == '.' || text[i] == ':') {
      if (!lua_rl_getfield(L, text+dot, i-dot))
	goto error;  /* Invalid prefix. */
      dot = i+1;  /* Points to first char after dot/colon. */
    }

  /* Add all matches against keywords if there is no dot/colon. */
  if (dot == 0)
    for (i = 0; (s = lua_rl_keywords[i]) != NULL; i++)
      if (!strncmp(s, text, n) && lua_rl_dmadd(&ml, NULL, 0, s, ' '))
	goto error;

  /* Add all valid matches from all tables/metatables. */
  loop = 0;  /* Avoid infinite metatable loops. */
  do {
    if (lua_istable(L, -1) &&
	(loop == 0 || !lua_rawequal(L, -1, LUA_GLOBALSINDEX)))
      for (lua_pushnil(L); lua_next(L, -2); lua_pop(L, 1))
	if (lua_type(L, -2) == LUA_TSTRING) {
	  s = lua_tostring(L, -2);
	  /* Only match names starting with '_' if explicitly requested. */
	  if (!strncmp(s, text+dot, n-dot) && valididentifier(s) &&
	      (*s != '_' || text[dot] == '_')) {
	    int suf = ' ';  /* Default suffix is a space. */
	    switch (lua_type(L, -1)) {
	    case LUA_TTABLE:	suf = '.'; break;  /* No way to guess ':'. */
	    case LUA_TFUNCTION:	suf = '('; break;
	    case LUA_TUSERDATA:
	      if (lua_getmetatable(L, -1)) { lua_pop(L, 1); suf = ':'; }
	      break;
	    }
	    if (lua_rl_dmadd(&ml, text, dot, s, suf)) goto error;
	  }
	}
  } while (++loop < 20 && lua_rl_getmetaindex(L));

  if (ml.idx == 0) {
error:
    lua_settop(L, savetop);
    return NULL;
  } else {
    /* list[0] holds the common prefix of all matches (may be ""). */
    /* If there is only one match, list[0] and list[1] will be the same. */
    if (!(ml.list[0] = (char *)malloc(sizeof(char)*(ml.matchlen+1))))
      goto error;
    memcpy(ml.list[0], ml.list[1], ml.matchlen);
    ml.list[0][ml.matchlen] = '\0';
    /* Add the NULL list terminator. */
    if (lua_rl_dmadd(&ml, NULL, 0, NULL, 0)) goto error;
  }

  lua_settop(L, savetop);
#if RL_READLINE_VERSION >= 0x0600
  rl_completion_suppress_append = 1;
#endif
  return ml.list;
}